

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2point_vector_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::S2PointVectorLayer::Build(S2PointVectorLayer *this,Graph *g,S2Error *error)

{
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *this_00;
  ulong uVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_01;
  size_type sVar2;
  S2Point *__x;
  int32 local_84;
  Edge *pEStack_80;
  int set_id;
  Edge *edge;
  int local_64;
  undefined1 local_60 [4];
  EdgeId edge_id;
  vector<int,_std::allocator<int>_> labels;
  LabelFetcher fetcher;
  S2Error *error_local;
  Graph *g_local;
  S2PointVectorLayer *this_local;
  
  S2Builder::Graph::LabelFetcher::LabelFetcher
            ((LabelFetcher *)
             &labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,g,DIRECTED);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_60);
  local_64 = 0;
  while( true ) {
    uVar1 = (ulong)local_64;
    this_01 = S2Builder::Graph::edges(g);
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(this_01);
    if (sVar2 <= uVar1) break;
    pEStack_80 = S2Builder::Graph::edge(g,local_64);
    if (pEStack_80->first == pEStack_80->second) {
      this_00 = this->points_;
      __x = S2Builder::Graph::vertex(g,pEStack_80->first);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back(this_00,__x);
      if (this->label_set_ids_ != (LabelSetIds *)0x0) {
        S2Builder::Graph::LabelFetcher::Fetch
                  ((LabelFetcher *)
                   &labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_64,
                   (vector<int,_std::allocator<int>_> *)local_60);
        local_84 = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                             (this->label_set_lexicon_,(vector<int,_std::allocator<int>_> *)local_60
                             );
        std::vector<int,_std::allocator<int>_>::push_back(this->label_set_ids_,&local_84);
      }
    }
    else {
      S2Error::Init(error,INVALID_ARGUMENT,"Found non-degenerate edges");
    }
    local_64 = local_64 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  S2Builder::Graph::LabelFetcher::~LabelFetcher
            ((LabelFetcher *)
             &labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void S2PointVectorLayer::Build(const Graph& g, S2Error* error) {
  Graph::LabelFetcher fetcher(g, EdgeType::DIRECTED);

  vector<Label> labels;  // Temporary storage for labels.
  for (EdgeId edge_id = 0; edge_id < g.edges().size(); edge_id++) {
    auto& edge = g.edge(edge_id);
    if (edge.first != edge.second) {
      error->Init(S2Error::INVALID_ARGUMENT, "Found non-degenerate edges");
      continue;
    }
    points_->push_back(g.vertex(edge.first));
    if (label_set_ids_) {
      fetcher.Fetch(edge_id, &labels);
      int set_id = label_set_lexicon_->Add(labels);
      label_set_ids_->push_back(set_id);
    }
  }
}